

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O1

GdlLanguageDefn * __thiscall GrcSymbolTableEntry::LanguageDefnData(GrcSymbolTableEntry *this)

{
  GdlLanguageDefn *pGVar1;
  
  if ((this->m_fHasData == true) && (this->m_pData != (GdlDefn *)0x0)) {
    pGVar1 = (GdlLanguageDefn *)
             __dynamic_cast(this->m_pData,&GdlDefn::typeinfo,&GdlLanguageDefn::typeinfo,0);
    return pGVar1;
  }
  return (GdlLanguageDefn *)0x0;
}

Assistant:

GdlLanguageDefn * GrcSymbolTableEntry::LanguageDefnData()
{
	if (!HasData())
		return NULL;

	GdlLanguageDefn * plang = dynamic_cast<GdlLanguageDefn *>(Data());
	return plang;
}